

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::SMDImporter::ParseSignedInt(SMDImporter *this,char *szCurrent,char **szCurrentOut,int *out)

{
  bool bVar1;
  int iVar2;
  char *local_20;
  
  local_20 = szCurrent;
  bVar1 = SkipSpaces<char>(&local_20);
  if (bVar1) {
    iVar2 = strtol10(local_20,szCurrentOut);
    *out = iVar2;
  }
  return bVar1;
}

Assistant:

bool SMDImporter::ParseSignedInt(const char* szCurrent, const char** szCurrentOut, int& out) {
    if(!SkipSpaces(&szCurrent)) {
        return false;
    }

    out = strtol10(szCurrent,szCurrentOut);
    return true;
}